

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O0

size_t jpgClean(uchar *data,size_t len)

{
  ulong local_30;
  size_t i;
  uint8_t EOI [2];
  size_t len_local;
  uchar *data_local;
  
  local_30 = 0;
  len_local = (size_t)data;
  while( true ) {
    if (len <= local_30) {
      return len;
    }
    if (((*(char *)len_local == -1) && (*(char *)(len_local + 1) == -0x27)) && (local_30 + 1 <= len)
       ) break;
    local_30 = local_30 + 1;
    len_local = len_local + 1;
  }
  return local_30 + 1;
}

Assistant:

size_t jpgClean(const unsigned char *data, size_t len)
{
    uint8_t EOI[2] = {0xff, 0xd9};

    for(size_t i=0; i<len; i++)
    {
        if(*data++ == EOI[0]) {
            if(*data == EOI[1]) {
                if(i+1 <= len) {
                    return (i+1);
                }
            }
        }
    }
    return len;
}